

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsg_model.c
# Opt level: O0

fsg_link_t * fsg_model_null_trans(fsg_model_t *fsg,int32 i,int32 j)

{
  int32 iVar1;
  fsg_model_t *local_28;
  void *val;
  int32 j_local;
  int32 i_local;
  fsg_model_t *fsg_local;
  
  if (fsg->trans[i].null_trans == (hash_table_t *)0x0) {
    fsg_local = (fsg_model_t *)0x0;
  }
  else {
    val._0_4_ = j;
    val._4_4_ = i;
    _j_local = fsg;
    iVar1 = hash_table_lookup_bkey(fsg->trans[i].null_trans,(char *)&val,4,&local_28);
    if (iVar1 < 0) {
      fsg_local = (fsg_model_t *)0x0;
    }
    else {
      fsg_local = local_28;
    }
  }
  return (fsg_link_t *)fsg_local;
}

Assistant:

fsg_link_t *
fsg_model_null_trans(fsg_model_t * fsg, int32 i, int32 j)
{
    void *val;

    if (fsg->trans[i].null_trans == NULL)
        return NULL;
    if (hash_table_lookup_bkey(fsg->trans[i].null_trans, (char const *) &j,
                               sizeof(j), &val) < 0)
        return NULL;
    return (fsg_link_t *) val;
}